

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penguinv.cpp
# Opt level: O0

uint32_t penguinV::Sum(Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height)

{
  bool bVar1;
  uint32_t uVar2;
  ImageTypeManager *this;
  FunctionTableHolder *pFVar3;
  reference puVar4;
  uint32_t in_ECX;
  uint32_t in_EDX;
  uint32_t in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  uint32_t in_R8D;
  ImageManager manager;
  SumForm2 funcTemp;
  const_iterator type;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *types;
  uint8_t imageType;
  SumForm2 func;
  ImageTypeManager *registrator;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  uint8_t requiredType;
  ImageTypeManager *in_stack_ffffffffffffff00;
  ImageManager *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff38;
  uint8_t in_stack_ffffffffffffff3f;
  ImageTypeManager *in_stack_ffffffffffffff40;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_58;
  undefined1 local_50 [24];
  undefined1 *local_38;
  uint8_t local_29;
  SumForm2 local_28;
  ImageTypeManager *local_20;
  
  this = ImageTypeManager::instance();
  local_20 = this;
  PenguinV_Image::ImageTemplate<unsigned_char>::type(in_RDI);
  pFVar3 = ImageTypeManager::functionTable(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3f);
  local_28 = pFVar3->Sum;
  local_29 = PenguinV_Image::ImageTemplate<unsigned_char>::type(in_RDI);
  if ((local_28 == (SumForm2)0x0) &&
     (bVar1 = ImageTypeManager::isIntertypeConversionEnabled(local_20), bVar1)) {
    ImageTypeManager::imageTypes
              ((ImageTypeManager *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    local_38 = local_50;
    local_58._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cbegin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    while( true ) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cend
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)in_stack_ffffffffffffff00,
                         (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      if (!bVar1) break;
      in_stack_ffffffffffffff00 = local_20;
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator*(&local_58);
      pFVar3 = ImageTypeManager::functionTable(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3f);
      if (pFVar3->Sum != (SumForm2)0x0) {
        local_28 = pFVar3->Sum;
        puVar4 = __gnu_cxx::
                 __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator*(&local_58);
        local_29 = *puVar4;
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator++(&local_58);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  }
  requiredType = (uint8_t)((uint)in_stack_fffffffffffffefc >> 0x18);
  (anonymous_namespace)::
  verifyFunction<unsigned_int(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,unsigned_int,unsigned_int)>
            ((_func_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint *)
             CONCAT44(in_ESI,in_EDX),(char *)CONCAT44(in_ECX,in_R8D));
  anon_unknown.dwarf_9a3be::ImageManager::ImageManager
            ((ImageManager *)in_stack_ffffffffffffff00,requiredType);
  uVar2 = (*local_28)(in_RDI,in_ESI,in_EDX,in_ECX,in_R8D);
  anon_unknown.dwarf_9a3be::ImageManager::~ImageManager(in_stack_ffffffffffffff30);
  return uVar2;
}

Assistant:

uint32_t Sum( const Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height )
    {
        initialize( image, Sum );
        return func( image, x, y, width, height );
    }